

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O1

xformAtomRecords * newXformAtomRecord(char *rec,abrMkAtomProc *mkAtom,void *atomstuff)

{
  double dVar1;
  xformAtomRecords *__ptr;
  atomPtr paVar2;
  
  if (rec != (char *)0x0) {
    __ptr = (xformAtomRecords *)malloc(0x28);
    if (__ptr == (xformAtomRecords *)0x0) {
      warn("could not create Xform atom record");
    }
    else {
      __ptr->next = (xformAtomRecords_t *)0x0;
      paVar2 = (*mkAtom)(rec,atomstuff);
      __ptr->a = paVar2;
      if (paVar2 != (atomPtr)0x0) {
        (__ptr->loc).z = (paVar2->loc).z;
        dVar1 = (paVar2->loc).y;
        (__ptr->loc).x = (paVar2->loc).x;
        (__ptr->loc).y = dVar1;
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (xformAtomRecords *)0x0;
}

Assistant:

xformAtomRecords * newXformAtomRecord(char *rec, abrMkAtomProc mkAtom, void *atomstuff) {
   xformAtomRecords *xr = NULL;
   int getAtno(int);

   if (rec) {
      xr = (xformAtomRecords *)malloc(sizeof(xformAtomRecords));
      if (!xr) {
         warn("could not create Xform atom record");
         return NULL;
      }
      xr->next = NULL;
      xr->a = mkAtom(rec, atomstuff);

      if (xr->a) {
	                       /* record the original position on the atom */
	 xr->loc = xr->a->loc; /* so that we can continually return to it  */
      }
      else {
	 free(xr); /* may be an H when implicitH processing is being used */
	 xr = NULL;
      }
   }
   return xr;
}